

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-multicast.c
# Opt level: O3

int mc_unpacklocal(lua_State *L)

{
  long *plVar1;
  ulong uVar2;
  
  plVar1 = (long *)lua_touserdata(L,1);
  uVar2 = luaL_checkinteger(L,2);
  if ((int)uVar2 == 8) {
    lua_pushlightuserdata(L,(void *)*plVar1);
    lua_pushlightuserdata(L,*(void **)(*plVar1 + 8));
    lua_pushinteger(L,(ulong)*(uint *)(*plVar1 + 4));
    return 3;
  }
  luaL_error(L,"Invalid multicast package size %d",uVar2 & 0xffffffff);
}

Assistant:

static int
mc_unpacklocal(lua_State *L) {
	struct mc_package ** pack = lua_touserdata(L,1);
	int sz = luaL_checkinteger(L,2);
	if (sz != sizeof(*pack)) {
		return luaL_error(L, "Invalid multicast package size %d", sz);
	}
	lua_pushlightuserdata(L, *pack);
	lua_pushlightuserdata(L, (*pack)->data);
	lua_pushinteger(L, (lua_Integer)((*pack)->size));
	return 3;
}